

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_pubnonce_serialize
              (secp256k1_context *ctx,uchar *out66,secp256k1_musig_pubnonce *nonce)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  secp256k1_ge *elem;
  size_t size;
  secp256k1_ge ges [2];
  size_t local_100;
  secp256k1_ge local_f8;
  secp256k1_ge local_90;
  
  if (ctx != (secp256k1_context *)0x0) {
    if (out66 == (uchar *)0x0) goto LAB_00110c1e;
    out66[0x30] = '\0';
    out66[0x31] = '\0';
    out66[0x32] = '\0';
    out66[0x33] = '\0';
    out66[0x34] = '\0';
    out66[0x35] = '\0';
    out66[0x36] = '\0';
    out66[0x37] = '\0';
    out66[0x38] = '\0';
    out66[0x39] = '\0';
    out66[0x3a] = '\0';
    out66[0x3b] = '\0';
    out66[0x3c] = '\0';
    out66[0x3d] = '\0';
    out66[0x3e] = '\0';
    out66[0x3f] = '\0';
    out66[0x20] = '\0';
    out66[0x21] = '\0';
    out66[0x22] = '\0';
    out66[0x23] = '\0';
    out66[0x24] = '\0';
    out66[0x25] = '\0';
    out66[0x26] = '\0';
    out66[0x27] = '\0';
    out66[0x28] = '\0';
    out66[0x29] = '\0';
    out66[0x2a] = '\0';
    out66[0x2b] = '\0';
    out66[0x2c] = '\0';
    out66[0x2d] = '\0';
    out66[0x2e] = '\0';
    out66[0x2f] = '\0';
    out66[0x10] = '\0';
    out66[0x11] = '\0';
    out66[0x12] = '\0';
    out66[0x13] = '\0';
    out66[0x14] = '\0';
    out66[0x15] = '\0';
    out66[0x16] = '\0';
    out66[0x17] = '\0';
    out66[0x18] = '\0';
    out66[0x19] = '\0';
    out66[0x1a] = '\0';
    out66[0x1b] = '\0';
    out66[0x1c] = '\0';
    out66[0x1d] = '\0';
    out66[0x1e] = '\0';
    out66[0x1f] = '\0';
    out66[0] = '\0';
    out66[1] = '\0';
    out66[2] = '\0';
    out66[3] = '\0';
    out66[4] = '\0';
    out66[5] = '\0';
    out66[6] = '\0';
    out66[7] = '\0';
    out66[8] = '\0';
    out66[9] = '\0';
    out66[10] = '\0';
    out66[0xb] = '\0';
    out66[0xc] = '\0';
    out66[0xd] = '\0';
    out66[0xe] = '\0';
    out66[0xf] = '\0';
    out66[0x40] = '\0';
    out66[0x41] = '\0';
    if (nonce == (secp256k1_musig_pubnonce *)0x0) goto LAB_00110c1e;
    iVar2 = secp256k1_musig_pubnonce_load(ctx,&local_f8,nonce);
    if (iVar2 == 0) {
      return 0;
    }
    lVar4 = 0;
    elem = &local_f8;
    bVar3 = true;
    while( true ) {
      local_100 = 0x21;
      iVar2 = secp256k1_eckey_pubkey_serialize(elem,out66 + lVar4,&local_100,1);
      if ((iVar2 == 0) || (local_100 != 0x21)) break;
      lVar4 = 0x21;
      bVar1 = !bVar3;
      elem = &local_90;
      bVar3 = false;
      if (bVar1) {
        return 1;
      }
    }
    secp256k1_musig_pubnonce_serialize_cold_1();
  }
  secp256k1_musig_pubnonce_serialize_cold_3();
LAB_00110c1e:
  secp256k1_musig_pubnonce_serialize_cold_2();
  return 0;
}

Assistant:

int secp256k1_musig_pubnonce_serialize(const secp256k1_context* ctx, unsigned char *out66, const secp256k1_musig_pubnonce* nonce) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(out66 != NULL);
    memset(out66, 0, 66);
    ARG_CHECK(nonce != NULL);

    if (!secp256k1_musig_pubnonce_load(ctx, ges, nonce)) {
        return 0;
    }
    for (i = 0; i < 2; i++) {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(&ges[i], &out66[33*i], &size, 1);
#ifdef VERIFY
        /* serialize must succeed because the point was just loaded */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
    return 1;
}